

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory-stream.c
# Opt level: O2

cc_bool MemoryStream_SetPosition
                  (MemoryStream *memory_stream,ptrdiff_t offset,MemoryStream_Origin origin)

{
  if (origin == MEMORYSTREAM_END) {
    offset = offset + memory_stream->end;
  }
  else {
    if (origin == MEMORYSTREAM_CURRENT) {
      memory_stream->position = memory_stream->position + offset;
      return '\x01';
    }
    if (origin != MEMORYSTREAM_START) {
      return '\0';
    }
  }
  memory_stream->position = offset;
  return '\x01';
}

Assistant:

cc_bool MemoryStream_SetPosition(MemoryStream* const memory_stream, const ptrdiff_t offset, const enum MemoryStream_Origin origin)
{
	switch (origin)
	{
		case MEMORYSTREAM_START:
			memory_stream->position = (size_t)offset;
			break;

		case MEMORYSTREAM_CURRENT:
			memory_stream->position = (size_t)(memory_stream->position + offset);
			break;

		case MEMORYSTREAM_END:
			memory_stream->position = (size_t)(memory_stream->end + offset);
			break;

		default:
			return cc_false;
	}

	return cc_true;
}